

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastEntityStatePdu.cpp
# Opt level: O2

void __thiscall DIS::FastEntityStatePdu::FastEntityStatePdu(FastEntityStatePdu *this)

{
  long lVar1;
  
  EntityInformationFamilyPdu::EntityInformationFamilyPdu(&this->super_EntityInformationFamilyPdu);
  (this->super_EntityInformationFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__FastEntityStatePdu_001b1008;
  *(undefined8 *)&(this->super_EntityInformationFamilyPdu).super_Pdu.field_0x14 = 0;
  this->_entityKind = '\0';
  this->_domain = '\0';
  this->_country = 0;
  this->_category = '\0';
  this->_subcategory = '\0';
  this->_specific = '\0';
  this->_extra = '\0';
  this->_altEntityKind = '\0';
  this->_altDomain = '\0';
  this->_altCountry = 0;
  this->_altCategory = '\0';
  this->_altSubcategory = '\0';
  this->_altSpecific = '\0';
  this->_altExtra = '\0';
  this->_xVelocity = 0.0;
  this->_yVelocity = 0.0;
  *(undefined8 *)&this->_zVelocity = 0;
  *(undefined8 *)((long)&this->_xLocation + 4) = 0;
  *(undefined8 *)((long)&this->_yLocation + 4) = 0;
  *(undefined8 *)((long)&this->_zLocation + 4) = 0;
  *(undefined8 *)((long)&this->_psi + 1) = 0;
  *(undefined8 *)((long)&this->_phi + 1) = 0;
  this->_yAngularVelocity = 0.0;
  this->_zAngularVelocity = 0.0;
  this->_xAcceleration = 0.0;
  this->_yAcceleration = 0.0;
  this->_zAcceleration = 0.0;
  this->_xAngularVelocity = 0.0;
  *(undefined8 *)&this->_capabilities = 0;
  *(undefined8 *)
   ((long)&(this->_articulationParameters).
           super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->_articulationParameters).
  super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_articulationParameters).
  super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Pdu::setPduType((Pdu *)this,'\x01');
  for (lVar1 = -0xf; lVar1 != 0; lVar1 = lVar1 + 1) {
    this->_otherParameters[lVar1 + 0xf] = '\0';
  }
  for (lVar1 = -0xc; lVar1 != 0; lVar1 = lVar1 + 1) {
    this->_marking[lVar1 + 0xc] = '\0';
  }
  return;
}

Assistant:

FastEntityStatePdu::FastEntityStatePdu() : EntityInformationFamilyPdu(),
   _site(0), 
   _application(0), 
   _entity(0), 
   _forceId(0), 
   _numberOfArticulationParameters(0), 
   _entityKind(0), 
   _domain(0), 
   _country(0), 
   _category(0), 
   _subcategory(0), 
   _specific(0), 
   _extra(0), 
   _altEntityKind(0), 
   _altDomain(0), 
   _altCountry(0), 
   _altCategory(0), 
   _altSubcategory(0), 
   _altSpecific(0), 
   _altExtra(0), 
   _xVelocity(0.0), 
   _yVelocity(0.0), 
   _zVelocity(0.0), 
   _xLocation(0.0), 
   _yLocation(0.0), 
   _zLocation(0.0), 
   _psi(0.0), 
   _theta(0.0), 
   _phi(0.0), 
   _entityAppearance(0), 
   _deadReckoningAlgorithm(0), 
   _xAcceleration(0.0), 
   _yAcceleration(0.0), 
   _zAcceleration(0.0), 
   _xAngularVelocity(0.0), 
   _yAngularVelocity(0.0), 
   _zAngularVelocity(0.0), 
   _capabilities(0)
{
    setPduType( 1 );
     // Initialize fixed length array
     for(int lengthotherParameters= 0; lengthotherParameters < 15; lengthotherParameters++)
     {
         _otherParameters[lengthotherParameters] = 0;
     }

     // Initialize fixed length array
     for(int lengthmarking= 0; lengthmarking < 12; lengthmarking++)
     {
         _marking[lengthmarking] = 0;
     }

}